

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

uint8_t xml_parser_peek(xml_parser *parser,size_t n)

{
  ulong uVar1;
  ushort **ppuVar2;
  ulong uVar3;
  
  uVar3 = parser->position;
  uVar1 = parser->length;
  if (uVar3 < uVar1) {
    ppuVar2 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar2 + (ulong)parser->buffer[uVar3] * 2 + 1) & 0x20) == 0) {
        if (n == 0) {
          return parser->buffer[uVar3];
        }
        n = 0;
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return '\0';
}

Assistant:

static uint8_t xml_parser_peek(struct xml_parser* parser, size_t n) {
	size_t position = parser->position;

	while (position < parser->length) {
		if (!isspace(parser->buffer[position])) {
			if (n == 0) {
				return parser->buffer[position];
			} else {
				--n;
			}
		}

		position++;
	}

	return 0;
}